

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataAllocator::InitializeChunkStateInternal
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,
          idx_t offset,bool recompute,bool init_heap_pointers,bool init_heap_sizes,
          unsafe_vector<reference<TupleDataChunkPart>_> *parts)

{
  data_ptr_t *row_locations;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  pointer prVar3;
  TupleDataChunkPart *part;
  idx_t iVar4;
  pthread_mutex_t *__mutex;
  data_ptr_t pdVar5;
  SelectionVector *old_heap_sel;
  pointer prVar6;
  ulong uVar7;
  ulong count;
  Vector old_heap_ptrs;
  Value local_d8;
  Vector new_heap_ptrs;
  
  row_locations = (data_ptr_t *)(chunk_state->row_locations).data;
  pdVar1 = (chunk_state->heap_locations).data;
  pdVar2 = (chunk_state->heap_sizes).data;
  prVar3 = (parts->
           super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar6 = (parts->
                super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
                ).
                super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar6 != prVar3; prVar6 = prVar6 + 1) {
    part = prVar6->_M_data;
    count = (ulong)part->count;
    iVar4 = this->layout->row_width;
    pdVar5 = GetRowPointer(this,pin_state,part);
    for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
      row_locations[offset + uVar7] = pdVar5;
      pdVar5 = pdVar5 + iVar4;
    }
    if (this->layout->all_constant == false) {
      if (part->total_heap_size == 0) {
        if (init_heap_sizes) {
          iVar4 = this->layout->heap_size_offset;
          for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
            *(ulong *)(pdVar2 + uVar7 * 8 + offset * 8) =
                 (ulong)*(uint *)(row_locations[offset + uVar7] + iVar4);
          }
        }
      }
      else {
        if ((recompute) && (pin_state->properties != ALREADY_PINNED)) {
          pdVar5 = GetBaseHeapPointer(this,pin_state,part);
          if (part->base_heap_ptr != pdVar5) {
            __mutex = (pthread_mutex_t *)(part->lock)._M_data;
            ::std::mutex::lock((mutex *)&__mutex->__data);
            if (part->base_heap_ptr != pdVar5) {
              Value::POINTER((Value *)&new_heap_ptrs,
                             (uintptr_t)(part->base_heap_ptr + part->heap_block_offset));
              Vector::Vector(&old_heap_ptrs,(Value *)&new_heap_ptrs);
              Value::~Value((Value *)&new_heap_ptrs);
              Value::POINTER(&local_d8,(uintptr_t)(pdVar5 + part->heap_block_offset));
              Vector::Vector(&new_heap_ptrs,&local_d8);
              Value::~Value(&local_d8);
              old_heap_sel = ConstantVector::ZeroSelectionVector();
              RecomputeHeapPointers
                        (&old_heap_ptrs,old_heap_sel,row_locations,&new_heap_ptrs,offset,count,
                         this->layout,0);
              part->base_heap_ptr = pdVar5;
              Vector::~Vector(&new_heap_ptrs);
              Vector::~Vector(&old_heap_ptrs);
            }
            pthread_mutex_unlock(__mutex);
          }
        }
        if (init_heap_sizes) {
          iVar4 = this->layout->heap_size_offset;
          for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
            *(ulong *)(pdVar2 + uVar7 * 8 + offset * 8) =
                 (ulong)*(uint *)(row_locations[offset + uVar7] + iVar4);
          }
        }
        if (init_heap_pointers) {
          pdVar5 = pdVar1 + offset * 8;
          *(data_ptr_t *)pdVar5 = part->base_heap_ptr + part->heap_block_offset;
          for (uVar7 = 1; uVar7 < count; uVar7 = uVar7 + 1) {
            *(long *)(pdVar5 + uVar7 * 8) =
                 *(long *)(pdVar5 + uVar7 * 8 + -8) +
                 *(long *)(pdVar2 + uVar7 * 8 + offset * 8 + -8);
          }
        }
      }
    }
    offset = offset + count;
  }
  return;
}

Assistant:

void TupleDataAllocator::InitializeChunkStateInternal(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                                      idx_t offset, bool recompute, bool init_heap_pointers,
                                                      bool init_heap_sizes,
                                                      unsafe_vector<reference<TupleDataChunkPart>> &parts) {
	auto row_locations = FlatVector::GetData<data_ptr_t>(chunk_state.row_locations);
	auto heap_sizes = FlatVector::GetData<idx_t>(chunk_state.heap_sizes);
	auto heap_locations = FlatVector::GetData<data_ptr_t>(chunk_state.heap_locations);

	for (auto &part_ref : parts) {
		auto &part = part_ref.get();
		const auto next = part.count;

		// Set up row locations for the scan
		const auto row_width = layout.GetRowWidth();
		const auto base_row_ptr = GetRowPointer(pin_state, part);
		for (idx_t i = 0; i < next; i++) {
			row_locations[offset + i] = base_row_ptr + i * row_width;
		}

		if (layout.AllConstant()) { // Can't have a heap
			offset += next;
			continue;
		}

		if (part.total_heap_size == 0) {
			if (init_heap_sizes) { // No heap, but we need the heap sizes
				InitializeHeapSizes(row_locations, heap_sizes, offset, next, part, layout.GetHeapSizeOffset());
			}
			offset += next;
			continue;
		}

		// Check if heap block has changed - re-compute the pointers within each row if so
		if (recompute && pin_state.properties != TupleDataPinProperties::ALREADY_PINNED) {
			const auto new_base_heap_ptr = GetBaseHeapPointer(pin_state, part);
			if (part.base_heap_ptr != new_base_heap_ptr) {
				lock_guard<mutex> guard(part.lock);
				const auto old_base_heap_ptr = part.base_heap_ptr;
				if (old_base_heap_ptr != new_base_heap_ptr) {
					Vector old_heap_ptrs(
					    Value::POINTER(CastPointerToValue(old_base_heap_ptr + part.heap_block_offset)));
					Vector new_heap_ptrs(
					    Value::POINTER(CastPointerToValue(new_base_heap_ptr + part.heap_block_offset)));
					RecomputeHeapPointers(old_heap_ptrs, *ConstantVector::ZeroSelectionVector(), row_locations,
					                      new_heap_ptrs, offset, next, layout, 0);
					part.base_heap_ptr = new_base_heap_ptr;
				}
			}
		}

		if (init_heap_sizes) {
			InitializeHeapSizes(row_locations, heap_sizes, offset, next, part, layout.GetHeapSizeOffset());
		}

		if (init_heap_pointers) {
			// Set the pointers where the heap data will be written (if needed)
			heap_locations[offset] = part.base_heap_ptr + part.heap_block_offset;
			for (idx_t i = 1; i < next; i++) {
				auto idx = offset + i;
				heap_locations[idx] = heap_locations[idx - 1] + heap_sizes[idx - 1];
			}
		}

		offset += next;
	}
	D_ASSERT(offset <= STANDARD_VECTOR_SIZE);
}